

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessCommDatasetJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  string *this_00;
  string *this_01;
  ErrorCode EVar1;
  pointer pbVar2;
  element_type *peVar3;
  int iVar4;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  CommissionerDataset *extraout_RDX;
  CommissionerDataset *extraout_RDX_00;
  CommissionerDataset *extraout_RDX_01;
  CommissionerDataset *extraout_RDX_02;
  CommissionerDataset *aDataset;
  pointer puVar7;
  char *pcVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar9;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  CommissionerDataset dataset;
  format_string_checker<char> local_238;
  undefined1 local_208 [8];
  _Alloc_hider _Stack_200;
  undefined1 local_1f8 [24];
  _Alloc_hider local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  undefined1 local_1c0 [8];
  pointer local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b0;
  pointer puStack_1a0;
  pointer *local_198;
  pointer puStack_190;
  pointer local_188;
  pointer puStack_180;
  pointer local_178;
  undefined8 uStack_170;
  CommissionerAppPtr *local_168;
  ErrorCode local_160;
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  undefined4 local_138;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  ErrorCode local_110;
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  string local_e8;
  undefined4 local_c8 [2];
  long local_c0;
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Error local_a0;
  undefined4 local_78 [2];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  string local_50;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  this_00 = &(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  this_01 = &__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    local_208 = (undefined1  [8])((ulong)local_208 & 0xffffffff00000000);
    _Stack_200._M_p = "too few arguments";
    local_1f8._0_8_ = 0x11;
    local_1f8._8_8_ = 0;
    local_1e0._M_p = (pointer)0x0;
    pcVar8 = "too few arguments";
    local_1f8._16_8_ = (format_string_checker<char> *)local_208;
    do {
      pcVar5 = pcVar8 + 1;
      if (*pcVar8 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar8 + 2;
      }
      else if (*pcVar8 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar8,"",(format_string_checker<char> *)local_208);
      }
      pcVar8 = pcVar5;
    } while (pcVar5 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_208;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&local_238,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_110 = kInvalidArgs;
    local_108 = local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,local_238._0_8_,
               local_238.context_.super_basic_format_parse_context<char>.format_str_.data_ +
               local_238._0_8_);
    local_1c0._0_4_ = local_110;
    local_1b8 = (pointer)(aStack_1b0._M_local_buf + 8);
    std::__cxx11::string::_M_construct<char*>((string *)&local_1b8,local_108,local_108 + local_100);
    puStack_190 = (pointer)0x0;
    local_188 = (pointer)((ulong)local_188 & 0xffffffffffffff00);
    (__return_storage_ptr__->mError).mCode = local_1c0._0_4_;
    local_198 = &local_188;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_1b8);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_198);
    if (local_198 != &local_188) {
      operator_delete(local_198);
    }
    if (local_1b8 != (pointer)(aStack_1b0._M_local_buf + 8)) {
      operator_delete(local_1b8);
    }
    if (local_108 != local_f8) {
      operator_delete(local_108);
    }
LAB_0012b6b9:
    puVar7 = (pointer)local_238._0_8_;
    if ((size_t *)local_238._0_8_ ==
        &local_238.context_.super_basic_format_parse_context<char>.format_str_.size_) {
      return __return_storage_ptr__;
    }
    goto LAB_0012b6be;
  }
  local_238._0_8_ = &local_238.context_.super_basic_format_parse_context<char>.format_str_.size_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"get","");
  utils::ToLower((string *)local_1c0,pbVar2 + 1);
  utils::ToLower((string *)local_208,(string *)&local_238);
  if (local_1b8 == (pointer)_Stack_200._M_p) {
    if (local_1b8 == (pointer)0x0) {
      bVar9 = true;
    }
    else {
      iVar4 = bcmp((void *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),(void *)local_208,
                   (size_t)local_1b8);
      bVar9 = iVar4 == 0;
    }
  }
  else {
    bVar9 = false;
  }
  local_168 = aCommissioner;
  if (local_208 != (undefined1  [8])local_1f8) {
    operator_delete((void *)local_208);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_) != &aStack_1b0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_));
  }
  if ((size_t *)local_238._0_8_ !=
      &local_238.context_.super_basic_format_parse_context<char>.format_str_.size_) {
    operator_delete((void *)local_238._0_8_);
  }
  if (bVar9) {
    local_1c0._0_4_ = kNone;
    local_1b8 = (pointer)0x0;
    aStack_1b0._M_allocated_capacity = 0;
    aStack_1b0._8_8_ = 0;
    puStack_1a0 = (pointer)0x0;
    local_198 = (pointer *)0x0;
    puStack_190 = (pointer)0x0;
    local_188 = (pointer)0x0;
    puStack_180 = (pointer)0x0;
    local_178 = (pointer)0x0;
    uStack_170._0_2_ = 0;
    uStack_170._2_2_ = 0;
    uStack_170._4_2_ = 0;
    uStack_170._6_2_ = 0;
    peVar3 = (local_168->
             super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x1b])
              (local_78,peVar3,local_1c0,0xffff);
    local_208._0_4_ = local_78[0];
    pcVar8 = local_1f8 + 8;
    _Stack_200._M_p = pcVar8;
    std::__cxx11::string::_M_construct<char*>((string *)&_Stack_200,local_70,local_70 + local_68);
    local_1d8 = 0;
    local_1d0._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_208._0_4_;
    local_1e0._M_p = (pointer)&local_1d0;
    std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_200);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_1e0);
    EVar1 = (__return_storage_ptr__->mError).mCode;
    aDataset = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p);
      aDataset = extraout_RDX_00;
    }
    if (_Stack_200._M_p != pcVar8) {
      operator_delete(_Stack_200._M_p);
      aDataset = extraout_RDX_01;
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
      aDataset = extraout_RDX_02;
    }
    if (EVar1 == kNone) {
      CommissionerDatasetToJson_abi_cxx11_(&local_50,(commissioner *)local_1c0,aDataset);
      Value::Value((Value *)local_208,&local_50);
      (__return_storage_ptr__->mError).mCode = local_208._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_200);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_p != &local_1d0) {
        operator_delete(local_1e0._M_p);
      }
      if (_Stack_200._M_p != pcVar8) {
        operator_delete(_Stack_200._M_p);
      }
      paVar6 = &local_50.field_2;
      goto LAB_0012be18;
    }
  }
  else {
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_238._0_8_ = &local_238.context_.super_basic_format_parse_context<char>.format_str_.size_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"set","");
    utils::ToLower((string *)local_1c0,pbVar2 + 1);
    utils::ToLower((string *)local_208,(string *)&local_238);
    if (local_1b8 == (pointer)_Stack_200._M_p) {
      if (local_1b8 == (pointer)0x0) {
        bVar9 = true;
      }
      else {
        iVar4 = bcmp((void *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),(void *)local_208,
                     (size_t)local_1b8);
        bVar9 = iVar4 == 0;
      }
    }
    else {
      bVar9 = false;
    }
    if (local_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)local_208);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_) != &aStack_1b0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_));
    }
    if ((size_t *)local_238._0_8_ !=
        &local_238.context_.super_basic_format_parse_context<char>.format_str_.size_) {
      operator_delete((void *)local_238._0_8_);
    }
    if (!bVar9) {
      local_208._0_4_ = 0xd;
      _Stack_200._M_p = "\'{}\' is not a valid sub-command";
      local_1f8._0_8_ = 0x1f;
      local_1f8._8_8_ = 0x100000000;
      local_1e0._M_p =
           (pointer)::fmt::v10::detail::
                    parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar8 = "\'{}\' is not a valid sub-command";
      local_1f8._16_8_ = (format_string_checker<char> *)local_208;
      do {
        pcVar5 = pcVar8 + 1;
        if (*pcVar8 == '}') {
          if ((pcVar5 == "") || (*pcVar5 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar5 = pcVar8 + 2;
        }
        else if (*pcVar8 == '{') {
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar8,"",(format_string_checker<char> *)local_208);
        }
        pcVar8 = pcVar5;
      } while (pcVar5 != "");
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_208 = (undefined1  [8])pbVar2[1]._M_dataplus._M_p;
      _Stack_200._M_p = (pointer)pbVar2[1]._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x1f;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_208;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&local_238,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_00);
      local_160 = kInvalidCommand;
      local_158 = local_148;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,local_238._0_8_,
                 local_238.context_.super_basic_format_parse_context<char>.format_str_.data_ +
                 local_238._0_8_);
      local_1c0._0_4_ = local_160;
      local_1b8 = (pointer)(aStack_1b0._M_local_buf + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,local_158,local_158 + local_150);
      puStack_190 = (pointer)0x0;
      local_188 = (pointer)((ulong)local_188 & 0xffffffffffffff00);
      (__return_storage_ptr__->mError).mCode = local_1c0._0_4_;
      local_198 = &local_188;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_1b8);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_198);
      if (local_198 != &local_188) {
        operator_delete(local_198);
      }
      if (local_1b8 != (pointer)(aStack_1b0._M_local_buf + 8)) {
        operator_delete(local_1b8);
      }
      if (local_158 != local_148) {
        operator_delete(local_158);
      }
      goto LAB_0012b6b9;
    }
    local_1c0._0_4_ = kNone;
    local_1b8 = (pointer)0x0;
    aStack_1b0._M_allocated_capacity = 0;
    aStack_1b0._8_8_ = 0;
    puStack_1a0 = (pointer)0x0;
    local_198 = (pointer *)0x0;
    puStack_190 = (pointer)0x0;
    local_188 = (pointer)0x0;
    puStack_180 = (pointer)0x0;
    local_178 = (pointer)0x0;
    uStack_170._0_2_ = 0;
    uStack_170._2_2_ = 0;
    uStack_170._4_2_ = 0;
    uStack_170._6_2_ = 0;
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
      local_238._0_8_ = local_238._0_8_ & 0xffffffff00000000;
      local_238.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "too few arguments";
      local_238.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
      local_238.context_.super_basic_format_parse_context<char>._16_8_ = 0;
      local_238.parse_funcs_[0] = (parse_func)0x0;
      pcVar8 = "too few arguments";
      local_238.context_.types_ = local_238.types_;
      do {
        pcVar5 = pcVar8 + 1;
        if (*pcVar8 == '}') {
          if ((pcVar5 == "") || (*pcVar5 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar5 = pcVar8 + 2;
        }
        else if (*pcVar8 == '{') {
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar8,"",&local_238);
        }
        pcVar8 = pcVar5;
      } while (pcVar5 != "");
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_238;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_01);
      local_138 = 2;
      local_130 = local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_e8._M_dataplus._M_p,
                 local_e8._M_dataplus._M_p + local_e8._M_string_length);
      local_208._0_4_ = local_138;
      _Stack_200._M_p = local_1f8 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_200,local_130,local_130 + local_128);
      local_1d8 = 0;
      local_1d0._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_208._0_4_;
      local_1e0._M_p = (pointer)&local_1d0;
      std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_200);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_p != &local_1d0) {
        operator_delete(local_1e0._M_p);
      }
      if (_Stack_200._M_p != local_1f8 + 8) {
        operator_delete(_Stack_200._M_p);
      }
      if (local_130 != local_120) {
        operator_delete(local_130);
      }
      paVar6 = &local_e8.field_2;
    }
    else {
      CommissionerDatasetFromJson(&local_a0,(CommissionerDataset *)local_1c0,pbVar2 + 2);
      local_208._0_4_ = local_a0.mCode;
      pcVar8 = local_1f8 + 8;
      _Stack_200._M_p = pcVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_200,local_a0.mMessage._M_dataplus._M_p,
                 local_a0.mMessage._M_dataplus._M_p + local_a0.mMessage._M_string_length);
      local_1d8 = 0;
      local_1d0._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_208._0_4_;
      local_1e0._M_p = (pointer)&local_1d0;
      std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_200);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_1e0);
      EVar1 = (__return_storage_ptr__->mError).mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_p != &local_1d0) {
        operator_delete(local_1e0._M_p);
      }
      if (_Stack_200._M_p != pcVar8) {
        operator_delete(_Stack_200._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.mMessage._M_dataplus._M_p != &local_a0.mMessage.field_2) {
        operator_delete(local_a0.mMessage._M_dataplus._M_p);
      }
      if (EVar1 != kNone) goto LAB_0012be26;
      peVar3 = (local_168->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x1c])
                (local_c8,peVar3,local_1c0);
      local_208._0_4_ = local_c8[0];
      _Stack_200._M_p = pcVar8;
      std::__cxx11::string::_M_construct<char*>((string *)&_Stack_200,local_c0,local_b8 + local_c0);
      local_1d8 = 0;
      local_1d0._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_208._0_4_;
      local_1e0._M_p = (pointer)&local_1d0;
      std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_200);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_p != &local_1d0) {
        operator_delete(local_1e0._M_p);
      }
      if (_Stack_200._M_p != pcVar8) {
        operator_delete(_Stack_200._M_p);
      }
      paVar6 = &local_b0;
    }
LAB_0012be18:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar6->_M_local_buf + -0x10) != paVar6) {
      operator_delete(*(undefined1 **)(paVar6->_M_local_buf + -0x10));
    }
  }
LAB_0012be26:
  if (local_188 != (pointer)0x0) {
    operator_delete(local_188);
  }
  if (puStack_1a0 != (pointer)0x0) {
    operator_delete(puStack_1a0);
  }
  puVar7 = local_1b8;
  if (local_1b8 == (pointer)0x0) {
    return __return_storage_ptr__;
  }
LAB_0012b6be:
  operator_delete(puVar7);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessCommDatasetJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value value;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        CommissionerDataset dataset;
        SuccessOrExit(value = aCommissioner->GetCommissionerDataset(dataset, 0xFFFF));
        value = CommissionerDatasetToJson(dataset);
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        CommissionerDataset dataset;
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = CommissionerDatasetFromJson(dataset, aExpr[2]));
        SuccessOrExit(value = aCommissioner->SetCommissionerDataset(dataset));
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}